

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O1

void Res_WinMarkPaths(Res_Win_t *p)

{
  ulong uVar1;
  int iVar2;
  undefined4 uVar3;
  Abc_Ntk_t *pAVar4;
  long lVar5;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  long lVar8;
  int iVar9;
  
  pAVar4 = p->pNode->pNtk;
  if ((pAVar4->vTravIds).pArray == (int *)0x0) {
    iVar2 = pAVar4->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar9 = (int)uVar1;
    if ((pAVar4->vTravIds).nCap < iVar9) {
      piVar6 = (int *)malloc(uVar1 * 4);
      (pAVar4->vTravIds).pArray = piVar6;
      if (piVar6 == (int *)0x0) goto LAB_00485a72;
      (pAVar4->vTravIds).nCap = iVar9;
      in_RDX = extraout_RDX;
    }
    if (-500 < iVar2) {
      memset((pAVar4->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
      in_RDX = extraout_RDX_00;
    }
    (pAVar4->vTravIds).nSize = iVar9;
  }
  iVar2 = pAVar4->nTravIds;
  pAVar4->nTravIds = iVar2 + 1;
  if (iVar2 < 0x3fffffff) {
    pAVar4 = p->pNode->pNtk;
    if ((pAVar4->vTravIds).pArray == (int *)0x0) {
      iVar2 = pAVar4->vObjs->nSize;
      uVar1 = (long)iVar2 + 500;
      iVar9 = (int)uVar1;
      if ((pAVar4->vTravIds).nCap < iVar9) {
        piVar6 = (int *)malloc(uVar1 * 4);
        (pAVar4->vTravIds).pArray = piVar6;
        if (piVar6 == (int *)0x0) {
LAB_00485a72:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pAVar4->vTravIds).nCap = iVar9;
        in_RDX = extraout_RDX_01;
      }
      if (-500 < iVar2) {
        memset((pAVar4->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
        in_RDX = extraout_RDX_02;
      }
      (pAVar4->vTravIds).nSize = iVar9;
    }
    iVar2 = pAVar4->nTravIds;
    pAVar4->nTravIds = iVar2 + 1;
    if (iVar2 < 0x3fffffff) {
      pVVar7 = p->vLeaves;
      if (0 < pVVar7->nSize) {
        lVar8 = 0;
        do {
          lVar5 = *pVVar7->pArray[lVar8];
          uVar3 = *(undefined4 *)(lVar5 + 0xd8);
          iVar2 = (int)*(long *)((long)pVVar7->pArray[lVar8] + 0x10);
          Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar2 + 1,(int)in_RDX);
          if (((long)iVar2 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(undefined4 *)(*(long *)(lVar5 + 0xe8) + (long)iVar2 * 4) = uVar3;
          lVar8 = lVar8 + 1;
          pVVar7 = p->vLeaves;
          in_RDX = extraout_RDX_03;
        } while (lVar8 < pVVar7->nSize);
      }
      pVVar7 = p->vRoots;
      if (0 < pVVar7->nSize) {
        lVar8 = 0;
        do {
          Res_WinMarkPaths_rec((Abc_Obj_t *)pVVar7->pArray[lVar8],p->pNode,p->nLevTravMin);
          lVar8 = lVar8 + 1;
          pVVar7 = p->vRoots;
        } while (lVar8 < pVVar7->nSize);
      }
      return;
    }
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

void Res_WinMarkPaths( Res_Win_t * p )
{
    Abc_Obj_t * pObj;
    int i;
    // mark the leaves
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );
    // traverse from the roots and mark the nodes that can reach leaves
    // the nodes that do not reach leaves have previous trav ID
    // the nodes that reach leaves have current trav ID
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
        Res_WinMarkPaths_rec( pObj, p->pNode, p->nLevTravMin );
}